

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O1

BitMatrix * __thiscall
ZXing::OneD::Code93Writer::encode
          (BitMatrix *__return_storage_ptr__,Code93Writer *this,wstring *contents_,int width,
          int height)

{
  wchar_t wVar1;
  size_type sVar2;
  size_type sVar3;
  BitMatrix *pBVar4;
  int iVar5;
  void *pvVar6;
  invalid_argument *piVar7;
  long *plVar8;
  long *plVar9;
  size_t i;
  ulong uVar10;
  size_type sVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  vector<bool,_std::allocator<bool>_> result;
  string contents;
  vector<bool,_std::allocator<bool>_> local_d0;
  string local_a8;
  int local_88;
  int local_84;
  Code93Writer *local_80;
  BitMatrix *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = contents_->_M_string_length;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_88 = width;
  local_84 = height;
  local_80 = this;
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)&local_a8);
  if (sVar2 != 0) {
    sVar11 = 0;
    do {
      wVar1 = (contents_->_M_dataplus)._M_p[sVar11];
      if (wVar1 == L'\0') goto LAB_0016a6fb;
      cVar12 = (char)&local_a8;
      if (wVar1 < L'\x1b') {
        std::__cxx11::string::push_back(cVar12);
LAB_0016a6e2:
        std::__cxx11::string::push_back(cVar12);
      }
      else {
        if (wVar1 < L' ') {
          std::__cxx11::string::push_back(cVar12);
          goto LAB_0016a6e2;
        }
        if ((((wVar1 & 0x7ffffffbU) == 0x20) || (wVar1 == L'+')) || (wVar1 == L'%'))
        goto LAB_0016a6e2;
        if (wVar1 < L'-') {
          std::__cxx11::string::push_back(cVar12);
          goto LAB_0016a6e2;
        }
        if (wVar1 < L':') goto LAB_0016a6e2;
        if (wVar1 != L':') {
          if (wVar1 < L'@') {
            std::__cxx11::string::push_back(cVar12);
          }
          else {
            if (wVar1 == L'@') goto LAB_0016a6fb;
            if (L'Z' < wVar1) {
              if (wVar1 < L'`') {
                std::__cxx11::string::push_back(cVar12);
              }
              else {
                if (wVar1 == L'`') goto LAB_0016a6fb;
                if (wVar1 < L'{') {
                  std::__cxx11::string::push_back(cVar12);
                }
                else {
                  if (L'\x7f' < wVar1) {
                    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10,"bW");
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_70,
                               "Requested content contains a non-encodable character: \'","");
                    std::operator+(&local_50,&local_70,(char)wVar1);
                    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)*plVar8;
                    plVar9 = plVar8 + 2;
                    if (local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
                        (_Bit_type *)plVar9) {
                      local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                           (_Bit_type *)*plVar9;
                      local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = plVar8[3];
                      local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                           (_Bit_type *)
                           &local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish;
                    }
                    else {
                      local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                           (_Bit_type *)*plVar9;
                    }
                    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = plVar8[1];
                    *plVar8 = (long)plVar9;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    std::invalid_argument::invalid_argument(piVar7,(string *)&local_d0);
                    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  std::__cxx11::string::push_back(cVar12);
                }
              }
            }
          }
          goto LAB_0016a6e2;
        }
LAB_0016a6fb:
        std::__cxx11::string::append((char *)&local_a8);
      }
      sVar11 = sVar11 + 1;
    } while (sVar2 != sVar11);
  }
  sVar3 = local_a8._M_string_length;
  if (local_a8._M_string_length == 0) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Found empty contents");
  }
  else {
    if (local_a8._M_string_length < 0x51) {
      local_50._M_dataplus._M_p._0_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_d0,local_a8._M_string_length * 9 + 0x25,(bool *)&local_50,
                 (allocator_type *)&local_70);
      uVar10 = 0;
      AppendPattern(&local_d0,0,0x15e);
      uVar14 = 0x24;
      do {
        iVar13 = (int)uVar14;
        pvVar6 = memchr("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*",
                        (int)local_a8._M_dataplus._M_p[uVar10],0x31);
        AppendPattern(&local_d0,iVar13 + -0x1b,
                      *(int *)(CHARACTER_ENCODINGS +
                              (-(ulong)(pvVar6 == (void *)0x0) | (long)((int)pvVar6 + -0x1996f0)) *
                              4));
        uVar10 = uVar10 + 1;
        uVar14 = uVar14 + 9;
      } while (sVar3 != uVar10);
      iVar5 = ComputeChecksumIndex(&local_a8,0x14);
      AppendPattern(&local_d0,iVar13 + -0x12,*(int *)(CHARACTER_ENCODINGS + (long)iVar5 * 4));
      std::__cxx11::string::push_back((char)&local_a8);
      iVar5 = ComputeChecksumIndex(&local_a8,0xf);
      AppendPattern(&local_d0,iVar13 + -9,*(int *)(CHARACTER_ENCODINGS + (long)iVar5 * 4));
      AppendPattern(&local_d0,iVar13,0x15e);
      pBVar4 = local_78;
      local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar14 >> 6] =
           local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
      iVar13 = 10;
      if (-1 < local_80->_sidesMargin) {
        iVar13 = local_80->_sidesMargin;
      }
      WriterHelper::RenderResult(local_78,&local_d0,local_88,local_84,iVar13);
      if (local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ =
             local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ =
             local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      return pBVar4;
    }
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar7,
               "Requested contents should be less than 80 digits long after converting to extended encoding"
              );
  }
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BitMatrix
Code93Writer::encode(const std::wstring& contents_, int width, int height) const
{
	std::string contents = Code93ConvertToExtended(contents_);

	size_t length = contents.length();
	if (length == 0) {
		throw std::invalid_argument("Found empty contents");
	}
	if (length > 80) {
		throw std::invalid_argument("Requested contents should be less than 80 digits long after converting to extended encoding");
	}

	//length of code + 2 start/stop characters + 2 checksums, each of 9 bits, plus a termination bar
	size_t codeWidth = (contents.length() + 2 + 2) * 9 + 1;

	std::vector<bool> result(codeWidth, false);

	//start character (*)
	int pos = AppendPattern(result, 0, ASTERISK_ENCODING);

	for (size_t i = 0; i < length; i++) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[indexInString]);
	}

	//add two checksums
	int check1 = ComputeChecksumIndex(contents, 20);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check1]);

	//append the contents to reflect the first checksum added
	contents += static_cast<wchar_t>(ALPHABET[check1]);

	int check2 = ComputeChecksumIndex(contents, 15);
	pos += AppendPattern(result, pos, CHARACTER_ENCODINGS[check2]);

	//end character (*)
	pos += AppendPattern(result, pos, ASTERISK_ENCODING);

	//termination bar (single black bar)
	result[pos] = true;

	return WriterHelper::RenderResult(result, width, height, _sidesMargin >= 0 ? _sidesMargin : 10);
}